

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase268::run(TestCase268 *this)

{
  undefined1 *puVar1;
  Iface *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Thread *this_00;
  long lVar5;
  long lVar6;
  int iVar7;
  bool bVar8;
  DebugExpression<bool> _kjCondition_10;
  MutexGuarded<unsigned_int> value;
  uint m;
  Thread thread_1;
  PredicateImpl impl;
  uint m_3;
  uint m_1;
  Thread thread;
  Iface local_5f9 [3];
  int local_5e0 [3];
  undefined1 local_5d2;
  undefined1 local_5d1;
  MonotonicClock *local_5d0;
  Disposer local_5c8;
  Disposer *local_5c0;
  long local_5b8;
  Thread local_5b0;
  Function<void_()> local_598;
  Function<void_()> local_588;
  Function<void_()> local_578;
  undefined1 local_568 [16];
  Disposer *local_558;
  undefined1 *puStack_550;
  bool local_548;
  undefined7 uStack_547;
  Disposer local_3d0 [2];
  Mutex *local_3c0;
  Disposer *local_3b8;
  Disposer local_3b0;
  long local_3a8;
  Disposer *local_3a0;
  Mutex *local_398;
  long local_390;
  undefined1 local_388 [16];
  undefined1 *local_378;
  undefined8 *puStack_370;
  Mutex *local_1e8;
  Disposer *local_1e0;
  undefined1 local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined8 local_38;
  
  local_5d0 = systemPreciseMonotonicClock();
  puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
  _::Mutex::Mutex((Mutex *)puVar1);
  local_5e0[0] = 0x7b;
  local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
  _::Mutex::lock((Mutex *)puVar1,0);
  local_558 = (Disposer *)local_5e0;
  local_568._0_8_ = &PTR_check_00238130;
  local_388[0] = 1;
  local_388._8_8_ = 10000000000;
  local_568._8_8_ = &local_3b0;
  local_1e8 = (Mutex *)puVar1;
  local_1e0 = local_558;
  _::Mutex::wait((Mutex *)puVar1,local_568);
  iVar7 = local_5e0[0];
  local_5e0[0] = local_5e0[0] + 1;
  if (local_1e8 != (Mutex *)0x0) {
    _::Mutex::unlock(local_1e8,EXCLUSIVE,(Waiter *)0x0);
  }
  local_568._0_8_ = &local_5c8;
  local_5c8._vptr_Disposer._0_4_ = iVar7 + 3;
  local_568._8_4_ = 0x7e;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  bVar8 = iVar7 + 3 == 0x7e;
  local_548 = bVar8;
  if ((!bVar8) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x118,ERROR,"\"failed: expected \" \"m == 126\", _kjCondition",
               (char (*) [26])"failed: expected m == 126",
               (DebugComparison<unsigned_int_&,_int> *)local_568);
  }
  local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
  _::Mutex::lock((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1),1);
  puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
  local_568._8_4_ = 0x7c;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  local_548 = local_5e0[0] == 0x7c;
  local_568._0_8_ = local_5e0;
  _::Mutex::unlock((Mutex *)puVar1,SHARED,(Waiter *)0x0);
  if ((local_548 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x11a,ERROR,"\"failed: expected \" \"*value.lockShared() == 124\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 124",
               (DebugComparison<const_unsigned_int_&,_int> *)local_568);
  }
  local_578.impl.ptr = (Iface *)operator_new(0x10);
  (local_578.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00238160;
  local_578.impl.ptr[1]._vptr_Iface = (_func_int **)puVar1;
  local_578.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_2>>
        ::instance;
  Thread::Thread((Thread *)local_388,&local_578);
  pIVar2 = local_578.impl.ptr;
  if (local_578.impl.ptr != (Iface *)0x0) {
    local_578.impl.ptr = (Iface *)0x0;
    (**(local_578.impl.disposer)->_vptr_Disposer)
              (local_578.impl.disposer,
               (_func_int *)((long)&pIVar2->_vptr_Iface + (long)pIVar2->_vptr_Iface[-2]));
  }
  local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
  puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar1,0);
  local_568._0_8_ = &PTR_check_002381c8;
  local_568._8_8_ = &local_5b0;
  local_1e8 = (Mutex *)CONCAT71(local_1e8._1_7_,1);
  local_1e0 = (Disposer *)0x2540be400;
  local_5c8._vptr_Disposer = (_func_int **)puVar1;
  local_5c0 = (Disposer *)local_5e0;
  local_558 = (Disposer *)local_5e0;
  _::Mutex::wait((Mutex *)puVar1,local_568);
  iVar7 = local_5e0[0];
  local_5e0[0] = local_5e0[0] + 1;
  if ((Mutex *)local_5c8._vptr_Disposer != (Mutex *)0x0) {
    _::Mutex::unlock((Mutex *)local_5c8._vptr_Disposer,EXCLUSIVE,(Waiter *)0x0);
  }
  local_3b0._vptr_Disposer._0_4_ = iVar7 + 3;
  local_568._8_4_ = 0x144;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  bVar8 = iVar7 + 3 == 0x144;
  local_568._0_8_ = &local_3b0;
  local_548 = bVar8;
  if ((!bVar8) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x127,ERROR,"\"failed: expected \" \"m == 324\", _kjCondition",
               (char (*) [26])"failed: expected m == 324",
               (DebugComparison<unsigned_int_&,_int> *)local_568);
  }
  local_1e8 = (Mutex *)((ulong)local_1e8 & 0xffffffffffffff00);
  _::Mutex::lock((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1),1);
  local_568._0_8_ = local_5e0;
  local_568._8_4_ = 0x142;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  local_548 = local_5e0[0] == 0x142;
  _::Mutex::unlock((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1),SHARED,(Waiter *)0x0);
  if ((local_548 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x129,ERROR,"\"failed: expected \" \"*value.lockShared() == 322\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 322",
               (DebugComparison<const_unsigned_int_&,_int> *)local_568);
  }
  Thread::~Thread((Thread *)local_388);
  local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
  _::Mutex::lock((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1));
  local_5e0[0] = 0;
  _::Mutex::unlock((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1),EXCLUSIVE,(Waiter *)0x0);
  iVar7 = 0;
  local_388._0_8_ =
       _::HeapArrayDisposer::allocateImpl
                 (0x10,0,100,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_378 = (undefined1 *)
              ((long)&(((ThreadState *)(local_388._0_8_ + 0x540))->exception).ptr.field_1 + 0xd8);
  puStack_370 = &_::HeapArrayDisposer::instance;
  local_388._8_8_ = local_388._0_8_;
  do {
    this_00 = (Thread *)operator_new(0x18);
    local_568._8_8_ = operator_new(0x18);
    ((Iface *)local_568._8_8_)->_vptr_Iface = (_func_int **)&PTR_operator___002381f8;
    *(int *)&((Iface *)(local_568._8_8_ + 8))->_vptr_Iface = iVar7;
    ((Iface *)(local_568._8_8_ + 0x10))->_vptr_Iface =
         (_func_int **)((long)&local_5f9[0]._vptr_Iface + 1);
    local_568._0_8_ =
         &_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_5>>
          ::instance;
    Thread::Thread(this_00,(Function<void_()> *)local_568);
    uVar3 = local_568._8_8_;
    if ((Iface *)local_568._8_8_ != (Iface *)0x0) {
      local_568._8_8_ = (Iface *)0x0;
      (***(_func_int ***)local_568._0_8_)(local_568._0_8_,(*(_func_int ***)uVar3)[-2] + uVar3);
    }
    (((Function<void_()> *)local_388._8_8_)->impl).disposer =
         (Disposer *)&_::HeapDisposer<kj::Thread>::instance;
    (((Function<void_()> *)local_388._8_8_)->impl).ptr = (Iface *)this_00;
    local_388._8_8_ = local_388._8_8_ + 0x10;
    iVar7 = iVar7 + 1;
  } while (iVar7 != 100);
  local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
  puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar1,0);
  local_5c0 = (Disposer *)local_5e0;
  local_568._0_8_ = &PTR_check_00238290;
  local_568._8_8_ = &local_5b0;
  local_1e8 = (Mutex *)CONCAT71(local_1e8._1_7_,1);
  local_1e0 = (Disposer *)0x2540be400;
  local_5c8._vptr_Disposer = (_func_int **)puVar1;
  local_558 = local_5c0;
  _::Mutex::wait((Mutex *)puVar1,local_568);
  iVar7 = local_5e0[0];
  local_5e0[0] = local_5e0[0] + 1;
  if ((Mutex *)local_5c8._vptr_Disposer != (Mutex *)0x0) {
    _::Mutex::unlock((Mutex *)local_5c8._vptr_Disposer,EXCLUSIVE,(Waiter *)0x0);
  }
  local_3b0._vptr_Disposer._0_4_ = iVar7;
  local_568._0_8_ = &local_3b0;
  local_568._8_4_ = 100;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  bVar8 = iVar7 == 100;
  local_548 = bVar8;
  if ((!bVar8) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x13d,ERROR,"\"failed: expected \" \"m == 100\", _kjCondition",
               (char (*) [26])"failed: expected m == 100",
               (DebugComparison<unsigned_int_&,_int> *)local_568);
  }
  local_1e8 = (Mutex *)((ulong)local_1e8 & 0xffffffffffffff00);
  _::Mutex::lock((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1),1);
  local_568._8_4_ = 0x65;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  local_548 = local_5e0[0] == 0x65;
  local_568._0_8_ = local_5e0;
  _::Mutex::unlock((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1),SHARED,(Waiter *)0x0);
  if ((local_548 == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<unsigned_int_const&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x13f,ERROR,"\"failed: expected \" \"*value.lockShared() == 101\", _kjCondition",
               (char (*) [44])"failed: expected *value.lockShared() == 101",
               (DebugComparison<const_unsigned_int_&,_int> *)local_568);
  }
  puVar1 = local_378;
  uVar4 = local_388._8_8_;
  uVar3 = local_388._0_8_;
  if ((ThreadState *)local_388._0_8_ != (ThreadState *)0x0) {
    local_388._0_8_ = (ThreadState *)0x0;
    local_388._8_8_ = (Function<void_(kj::Function<void_()>)> *)0x0;
    local_378 = (undefined1 *)0x0;
    (**(code **)*puStack_370)
              (puStack_370,uVar3,0x10,(long)(uVar4 - uVar3) >> 4,(long)puVar1 - uVar3 >> 4,
               ArrayDisposer::Dispose_<kj::Own<kj::Thread,_std::nullptr_t>_>::destruct);
  }
  lVar5 = (*(code *)**(undefined8 **)local_5d0)();
  local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
  puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar1,0);
  local_568._0_8_ = &PTR_check_002382c0;
  local_568._8_8_ = &local_5c8;
  local_388[0] = 1;
  local_388._8_8_ = 10000000;
  local_558 = (Disposer *)local_5e0;
  local_1e8 = (Mutex *)puVar1;
  local_1e0 = (Disposer *)local_5e0;
  _::Mutex::wait((Mutex *)puVar1,(DebugComparison<unsigned_int_&,_int> *)local_568);
  bVar8 = local_5e0[0] == 0x65;
  local_568._8_4_ = 0x65;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  local_548 = bVar8;
  if (!bVar8) {
    local_568._0_8_ = local_5e0;
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
              ((Fault *)local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x145,FAILED,"n == 101","_kjCondition,",
               (DebugComparison<unsigned_int_&,_int> *)local_568);
    _::Debug::Fault::fatal((Fault *)local_388);
  }
  local_568._0_8_ = local_5e0;
  lVar6 = (*(code *)**(undefined8 **)local_5d0)();
  local_388._0_8_ = lVar6 - lVar5;
  local_548 = 9999999 < (long)local_388._0_8_;
  local_568._8_8_ = (Iface *)0x989680;
  local_558 = (Disposer *)0x1eefc5;
  puStack_550 = &DAT_00000005;
  local_568._0_8_ = (Disposer *)local_388;
  if (((long)local_388._0_8_ < 10000000) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[44],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x147,ERROR,"\"failed: expected \" \"t >= 10 * kj::MILLISECONDS\", _kjCondition, t",
               (char (*) [44])"failed: expected t >= 10 * kj::MILLISECONDS",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                *)local_568,(Quantity<long,_kj::_::NanosecondLabel> *)local_388);
  }
  if (local_1e8 != (Mutex *)0x0) {
    _::Mutex::unlock(local_1e8,EXCLUSIVE,(Waiter *)0x0);
  }
  local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
  puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar1,0);
  local_568._0_8_ = &PTR_check_002382f0;
  local_568._8_8_ = &local_5c8;
  local_388[0] = 1;
  local_388._8_8_ = 10000000;
  local_558 = (Disposer *)local_5e0;
  local_1e8 = (Mutex *)puVar1;
  local_1e0 = (Disposer *)local_5e0;
  _::Mutex::wait((Mutex *)puVar1,(DebugComparison<unsigned_int_&,_int> *)local_568);
  bVar8 = local_5e0[0] == 0x65;
  local_568._8_4_ = 0x65;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  local_548 = bVar8;
  if (!bVar8) {
    local_568._0_8_ = local_5e0;
    _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
              ((Fault *)local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x14d,FAILED,"n == 101","_kjCondition,",
               (DebugComparison<unsigned_int_&,_int> *)local_568);
    _::Debug::Fault::fatal((Fault *)local_388);
  }
  local_568._0_8_ = local_5e0;
  lVar6 = (*(code *)**(undefined8 **)local_5d0)();
  local_388._0_8_ = lVar6 - lVar5;
  local_548 = 19999999 < (long)local_388._0_8_;
  local_568._8_8_ = (Iface *)0x1312d00;
  local_558 = (Disposer *)0x1eefc5;
  puStack_550 = &DAT_00000005;
  local_568._0_8_ = (Disposer *)local_388;
  if (((long)local_388._0_8_ < 20000000) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[44],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x14f,ERROR,"\"failed: expected \" \"t >= 20 * kj::MILLISECONDS\", _kjCondition, t",
               (char (*) [44])"failed: expected t >= 20 * kj::MILLISECONDS",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                *)local_568,(Quantity<long,_kj::_::NanosecondLabel> *)local_388);
  }
  if (local_1e8 != (Mutex *)0x0) {
    _::Mutex::unlock(local_1e8,EXCLUSIVE,(Waiter *)0x0);
  }
  local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
  puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
  _::Mutex::lock((Mutex *)puVar1,0);
  local_568._0_8_ = &PTR_check_00238320;
  local_568._8_8_ = &local_5c8;
  local_388[0] = 1;
  local_388._8_8_ = 10000000000;
  local_558 = (Disposer *)local_5e0;
  local_1e8 = (Mutex *)puVar1;
  local_1e0 = (Disposer *)local_5e0;
  _::Mutex::wait((Mutex *)puVar1,(DebugComparison<unsigned_int_&,_int> *)local_568);
  local_568._8_4_ = 0x65;
  local_558 = (Disposer *)0x1d019f;
  puStack_550 = &DAT_00000005;
  local_548 = local_5e0[0] == 0x65;
  if (local_5e0[0] == 0x65) {
    local_568._0_8_ = local_5e0;
    if (local_1e8 != (Mutex *)0x0) {
      _::Mutex::unlock(local_1e8,EXCLUSIVE,(Waiter *)0x0);
    }
    local_3b0._vptr_Disposer = local_3b0._vptr_Disposer & 0xffffffffffffff00;
    puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
    _::Mutex::lock((Mutex *)puVar1,0);
    local_3b0._vptr_Disposer = (_func_int **)&PTR_check_00238350;
    local_3a8 = (long)&local_5d2;
    local_50 = 1;
    local_48 = 10000000000;
    local_3c0 = (Mutex *)puVar1;
    local_3b8 = (Disposer *)local_5e0;
    local_3a0 = (Disposer *)local_5e0;
    _::Mutex::wait((Mutex *)puVar1,&local_3b0);
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[19]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x160,ERROR,"\"shouldn\'t get here\"",(char (*) [19])"shouldn\'t get here");
    }
    if (local_3c0 != (Mutex *)0x0) {
      _::Mutex::unlock(local_3c0,EXCLUSIVE,(Waiter *)0x0);
    }
    local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
    local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[154]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x161,ERROR,
                 "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\\\"oops threw\\\"); }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
                 ,(char (*) [154])
                  "code did not throw: value.when([](uint n) -> bool { KJ_FAIL_ASSERT(\"oops threw\"); }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
                );
    }
    if (local_568[0] == '\x01') {
      Exception::~Exception((Exception *)(local_568 + 8));
    }
    local_588.impl.ptr = (Iface *)operator_new(0x10);
    (local_588.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00238380;
    local_588.impl.ptr[1]._vptr_Iface = (_func_int **)puVar1;
    local_588.impl.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_15>>
          ::instance;
    Thread::Thread(&local_5b0,&local_588);
    pIVar2 = local_588.impl.ptr;
    if (local_588.impl.ptr != (Iface *)0x0) {
      local_588.impl.ptr = (Iface *)0x0;
      (**(local_588.impl.disposer)->_vptr_Disposer)
                (local_588.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)pIVar2);
    }
    local_5c8._vptr_Disposer = local_5c8._vptr_Disposer & 0xffffffffffffff00;
    puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
    _::Mutex::lock((Mutex *)puVar1,0);
    local_5c8._vptr_Disposer = (_func_int **)&PTR_check_002383e8;
    local_5c0 = (Disposer *)&local_5d1;
    local_40 = 1;
    local_38 = 10000000000;
    local_5b8 = (long)local_5e0;
    local_398 = (Mutex *)puVar1;
    local_390 = (long)local_5e0;
    _::Mutex::wait((Mutex *)puVar1,&local_5c8);
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[19]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x16d,ERROR,"\"shouldn\'t get here\"",(char (*) [19])"shouldn\'t get here");
    }
    if (local_398 != (Mutex *)0x0) {
      _::Mutex::unlock(local_398,EXCLUSIVE,(Waiter *)0x0);
    }
    local_388._0_8_ = local_388._0_8_ & 0xffffffffffffff00;
    local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
    if (_::Debug::minSeverity < 3) {
      _::Debug::log<char_const(&)[173]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x16e,ERROR,
                 "\"code did not throw: \" \"value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \\\"oops threw\\\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\\\"shouldn\'t get here\\\"); }, LONG_TIMEOUT)\""
                 ,(char (*) [173])
                  "code did not throw: value.when([](uint n) -> bool { KJ_ASSERT(n != 321, \"oops threw\"); return false; }, [](uint& n) { KJ_FAIL_EXPECT(\"shouldn\'t get here\"); }, LONG_TIMEOUT)"
                );
    }
    if (local_568[0] == '\x01') {
      Exception::~Exception((Exception *)(local_568 + 8));
    }
    Thread::~Thread(&local_5b0);
    local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
    puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
    _::Mutex::lock((Mutex *)puVar1,0);
    local_568._0_8_ = &PTR_check_00238418;
    local_388[0] = 1;
    local_388._8_8_ = 10000000000;
    local_568._8_8_ = &local_5b0;
    local_558 = (Disposer *)local_5e0;
    local_1e8 = (Mutex *)puVar1;
    local_1e0 = (Disposer *)local_5e0;
    _::Mutex::wait((Mutex *)puVar1,local_568);
    local_3d0[0]._vptr_Disposer._0_4_ = local_5e0[0];
    if (local_1e8 != (Mutex *)0x0) {
      _::Mutex::unlock(local_1e8,EXCLUSIVE,(Waiter *)0x0);
    }
    local_568._8_4_ = 0x141;
    local_558 = (Disposer *)0x1d019f;
    puStack_550 = &DAT_00000005;
    bVar8 = (int)local_3d0[0]._vptr_Disposer == 0x141;
    local_568._0_8_ = local_3d0;
    local_548 = bVar8;
    if ((!bVar8) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x176,ERROR,"\"failed: expected \" \"m == 321\", _kjCondition",
                 (char (*) [26])"failed: expected m == 321",
                 (DebugComparison<unsigned_int_&,_int> *)local_568);
    }
    lVar5 = (*(code *)**(undefined8 **)local_5d0)();
    local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
    puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
    _::Mutex::lock((Mutex *)puVar1,0);
    local_568._0_8_ = &PTR_check_00238448;
    local_388[0] = 1;
    local_388._8_8_ = 10000000;
    local_568._8_8_ = &local_5b0;
    local_558 = (Disposer *)local_5e0;
    local_1e8 = (Mutex *)puVar1;
    local_1e0 = (Disposer *)local_5e0;
    _::Mutex::wait((Mutex *)puVar1,local_568);
    lVar6 = (*(code *)**(undefined8 **)local_5d0)();
    local_568._0_8_ = lVar6 - lVar5;
    local_548 = 9999999 < (long)local_568._0_8_;
    local_568._8_8_ = (Iface *)0x989680;
    local_558 = (Disposer *)0x1eefc5;
    puStack_550 = &DAT_00000005;
    if (((long)local_568._0_8_ < 10000000) && (_::Debug::minSeverity < 3)) {
      _::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>,kj::Quantity<long,kj::_::NanosecondLabel>>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x17a,ERROR,
                 "\"failed: expected \" \"clock.now() - start >= 10 * kj::MILLISECONDS\", _kjCondition"
                 ,(char (*) [62])"failed: expected clock.now() - start >= 10 * kj::MILLISECONDS",
                 (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
                  *)local_568);
    }
    iVar7 = local_5e0[0];
    if (local_1e8 != (Mutex *)0x0) {
      _::Mutex::unlock(local_1e8,EXCLUSIVE,(Waiter *)0x0);
    }
    iVar7 = iVar7 + 1;
    local_3d0[0]._vptr_Disposer._0_4_ = iVar7;
    local_568._8_4_ = 0x142;
    local_558 = (Disposer *)0x1d019f;
    puStack_550 = &DAT_00000005;
    local_548 = iVar7 == 0x142;
    local_568._0_8_ = local_3d0;
    if ((iVar7 != 0x142) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x17d,ERROR,"\"failed: expected \" \"m == 322\", _kjCondition",
                 (char (*) [26])"failed: expected m == 322",
                 (DebugComparison<unsigned_int_&,_int> *)local_568);
    }
    local_598.impl.ptr = (Iface *)operator_new(0x10);
    (local_598.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00238478;
    local_598.impl.ptr[1]._vptr_Iface = (_func_int **)puVar1;
    local_598.impl.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase268::run()::$_21>>
          ::instance;
    Thread::Thread((Thread *)local_388,&local_598);
    pIVar2 = local_598.impl.ptr;
    if (local_598.impl.ptr != (Iface *)0x0) {
      local_598.impl.ptr = (Iface *)0x0;
      (**(local_598.impl.disposer)->_vptr_Disposer)
                (local_598.impl.disposer,
                 (_func_int *)((long)&pIVar2->_vptr_Iface + (long)pIVar2->_vptr_Iface[-2]));
    }
    local_568._0_8_ = local_568._0_8_ & 0xffffffffffffff00;
    puVar1 = (undefined1 *)((long)&local_5f9[0]._vptr_Iface + 1);
    _::Mutex::lock((Mutex *)puVar1,0);
    local_5b0.threadId = (unsigned_long_long)local_5e0;
    local_568._0_8_ = &PTR_check_002384e0;
    local_568._8_8_ = local_5f9;
    local_1e8 = (Mutex *)CONCAT71(local_1e8._1_7_,1);
    local_1e0 = (Disposer *)0x2540be400;
    local_5b0.state = (ThreadState *)puVar1;
    local_558 = (Disposer *)local_5b0.threadId;
    _::Mutex::wait((Mutex *)puVar1,local_568);
    iVar7 = local_5e0[0];
    if (local_5b0.state != (ThreadState *)0x0) {
      _::Mutex::unlock((Mutex *)local_5b0.state,EXCLUSIVE,(Waiter *)0x0);
    }
    local_3d0[0]._vptr_Disposer._0_4_ = iVar7;
    local_568._8_4_ = 0x28e;
    local_558 = (Disposer *)0x1d019f;
    puStack_550 = &DAT_00000005;
    local_548 = iVar7 == 0x28e;
    local_568._0_8_ = local_3d0;
    if ((iVar7 != 0x28e) && (_::Debug::minSeverity < 3)) {
      _::Debug::log<char_const(&)[26],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x187,ERROR,"\"failed: expected \" \"m == 654\", _kjCondition",
                 (char (*) [26])"failed: expected m == 654",
                 (DebugComparison<unsigned_int_&,_int> *)local_568);
    }
    Thread::~Thread((Thread *)local_388);
    _::Mutex::~Mutex((Mutex *)((long)&local_5f9[0]._vptr_Iface + 1));
    return;
  }
  local_568._0_8_ = local_5e0;
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
            ((Fault *)local_388,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
             ,0x155,FAILED,"n == 101","_kjCondition,",
             (DebugComparison<unsigned_int_&,_int> *)local_568);
  _::Debug::Fault::fatal((Fault *)local_388);
}

Assistant:

TEST(Mutex, WhenWithTimeout) {
  auto& clock = systemPreciseMonotonicClock();
  MutexGuarded<uint> value(123);

  // A timeout that won't expire.
  static constexpr Duration LONG_TIMEOUT = 10 * kj::SECONDS;

  {
    uint m = value.when([](uint n) { return n < 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 126);

    KJ_EXPECT(*value.lockShared() == 124);
  }

  {
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    uint m = value.when([](uint n) { return n > 200; }, [](uint& n) {
      ++n;
      return n + 2;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 324);

    KJ_EXPECT(*value.lockShared() == 322);
  }

  {
    // Stress test. 100 threads each wait for a value and then set the next value.
    *value.lockExclusive() = 0;

    auto threads = kj::heapArrayBuilder<kj::Own<kj::Thread>>(100);
    for (auto i: kj::zeroTo(100)) {
      threads.add(kj::heap<kj::Thread>([i,&value]() {
        if (i % 2 == 0) delay();
        uint m = value.when([i](const uint& n) { return n == i; },
            [](uint& n) { return n++; }, LONG_TIMEOUT);
        KJ_ASSERT(m == i);
      }));
    }

    uint m = value.when([](uint n) { return n == 100; }, [](uint& n) {
      return n++;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 100);

    KJ_EXPECT(*value.lockShared() == 101);
  }

  {
    auto start = clock.now();
    uint m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 10 * kj::MILLISECONDS, t);
      return 12;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 12);

    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      auto t = clock.now() - start;
      KJ_EXPECT(t >= 20 * kj::MILLISECONDS, t);
      return 34;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 34);

    m = value.when([](uint n) { return n > 0; }, [&](uint& n) {
      KJ_ASSERT(n == 101);
      return 56;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 56);
  }

  {
    // Throw from predicate.
    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_FAIL_ASSERT("oops threw");
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));

    // Throw from predicate later on.
    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 321;
    });

    KJ_EXPECT_THROW_MESSAGE("oops threw", value.when([](uint n) -> bool {
      KJ_ASSERT(n != 321, "oops threw");
      return false;
    }, [](uint& n) {
      KJ_FAIL_EXPECT("shouldn't get here");
    }, LONG_TIMEOUT));
  }

  {
    // Verify the exceptions didn't break the mutex.
    uint m = value.when([](uint n) { return n > 0; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 321);

    auto start = clock.now();
    m = value.when([](uint n) { return n == 0; }, [&](uint& n) {
      KJ_EXPECT(clock.now() - start >= 10 * kj::MILLISECONDS);
      return n + 1;
    }, 10 * kj::MILLISECONDS);
    KJ_EXPECT(m == 322);

    kj::Thread thread([&]() {
      delay();
      *value.lockExclusive() = 654;
    });

    m = value.when([](uint n) { return n > 500; }, [](uint& n) {
      return n;
    }, LONG_TIMEOUT);
    KJ_EXPECT(m == 654);
  }
}